

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpolynomial.cpp
# Opt level: O0

void __thiscall TPZPolynomial::TPZPolynomial(TPZPolynomial *this,TPZVec<double> *coef,REAL *tol)

{
  REAL *in_RDX;
  TPZPolynomial *in_RDI;
  int64_t in_stack_ffffffffffffffb8;
  TPZVec<double> *this_00;
  TPZVec<double> *in_stack_ffffffffffffffd8;
  TPZPolynomial *in_stack_ffffffffffffffe0;
  
  this_00 = &in_RDI->fCo;
  TPZVec<double>::TPZVec(this_00);
  TPZVec<double>::TPZVec(this_00,in_stack_ffffffffffffffb8);
  in_RDI->fImagem = 0.0;
  SetTolerance(in_RDI,in_RDX);
  SetCoef(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

TPZPolynomial::TPZPolynomial(const TPZVec<REAL> &coef, const REAL &tol): fReal(3), fImagem(0.0) {
    SetTolerance(tol);
    SetCoef(coef);
}